

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename_list.cxx
# Opt level: O0

void fl_filename_free_list(dirent ***list,int n)

{
  int local_18;
  int i;
  int n_local;
  dirent ***list_local;
  
  if (-1 < n) {
    for (local_18 = 0; local_18 < n; local_18 = local_18 + 1) {
      if ((*list)[local_18] != (dirent *)0x0) {
        free((*list)[local_18]);
      }
    }
    free(*list);
    *list = (dirent **)0x0;
  }
  return;
}

Assistant:

void fl_filename_free_list(struct dirent ***list, int n)
{
  if (n<0) return;
  
  int i;
  for (i = 0; i < n; i ++) {
    if ((*list)[i])
      free((*list)[i]);
  }  
  free(*list);
  *list = 0;
}